

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O0

int lib::base::DoIPairs(State *state)

{
  bool bVar1;
  State *in_RDI;
  Value VVar2;
  Value v;
  Value k;
  double num;
  Table *t;
  StackAPI api;
  undefined4 in_stack_ffffffffffffff88;
  ValueT in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  StackAPI *this;
  StackAPI *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Table *in_stack_ffffffffffffffb0;
  anon_union_8_9_8deb4486_for_Value_0 local_40;
  undefined4 local_38;
  double local_30;
  Table *local_28;
  StackAPI local_20;
  int local_4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT>
                    (in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                     (ValueT)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (bVar1) {
    this = &local_20;
    local_28 = luna::StackAPI::GetTable(in_stack_ffffffffffffff98,(int)((ulong)this >> 0x20));
    local_30 = luna::StackAPI::GetNumber(in_stack_ffffffffffffff98,(int)((ulong)this >> 0x20));
    local_30 = local_30 + 1.0;
    luna::Value::Value((Value *)&local_40);
    local_38 = 2;
    local_40.num_ = local_30;
    VVar2 = luna::Table::GetValue
                      (in_stack_ffffffffffffffb0,
                       (Value *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (VVar2.type_ == ValueT_Nil) {
      local_4 = 0;
    }
    else {
      luna::StackAPI::PushValue
                (this,(Value *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      luna::StackAPI::PushValue
                (this,(Value *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_4 = 2;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int DoIPairs(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_Table, luna::ValueT_Number))
            return 0;

        luna::Table *t = api.GetTable(0);
        double num = api.GetNumber(1) + 1;

        luna::Value k;
        k.type_ = luna::ValueT_Number;
        k.num_ = num;
        luna::Value v = t->GetValue(k);

        if (v.type_ == luna::ValueT_Nil)
            return 0;

        api.PushValue(k);
        api.PushValue(v);
        return 2;
    }